

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

void __thiscall amrex::ClusterList::~ClusterList(ClusterList *this)

{
  bool bVar1;
  reference ppCVar2;
  iterator End;
  iterator cli;
  list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *in_stack_ffffffffffffffd8;
  Cluster *this_00;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::begin
                 (in_stack_ffffffffffffffd8);
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::end
                 (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppCVar2 = std::_List_iterator<amrex::Cluster_*>::operator*
                        ((_List_iterator<amrex::Cluster_*> *)0x18e13ab);
    this_00 = *ppCVar2;
    if (this_00 != (Cluster *)0x0) {
      Cluster::~Cluster(this_00);
      operator_delete(this_00,0x30);
    }
    std::_List_iterator<amrex::Cluster_*>::operator++(local_10);
  }
  std::__cxx11::list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>::~list
            ((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)0x18e13e7);
  return;
}

Assistant:

ClusterList::~ClusterList ()
{
    for (std::list<Cluster*>::iterator cli = lst.begin(), End = lst.end();
         cli != End;
         ++cli)
    {
        delete *cli;
    }
}